

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::PhraseTests_Disjoint_Test::~PhraseTests_Disjoint_Test(PhraseTests_Disjoint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhraseTests, Disjoint) {
  EXPECT_TRUE(disjoint(Span{0, 0}, {0, 1}));
  EXPECT_TRUE(disjoint(Span{0, 0}, {1, 1}));
  EXPECT_TRUE(disjoint(Span{0, 1}, {1, 2}));
  EXPECT_TRUE(disjoint(Span{0, 1}, {1, 1}));
  EXPECT_TRUE(disjoint(Span{1, 1}, {0, 1}));
  EXPECT_FALSE(disjoint(Span{0, 1}, {0, 2}));
  EXPECT_FALSE(disjoint(Span{0, 4}, {1, 2}));
  EXPECT_FALSE(disjoint(Span{3, 4}, {0, 4}));
}